

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_api.c
# Opt level: O0

char * amqp_error_string(int code)

{
  char *pcVar1;
  int in_EDI;
  undefined4 local_4;
  
  local_4 = in_EDI;
  if (0 < in_EDI) {
    local_4 = -in_EDI;
  }
  pcVar1 = amqp_error_string2(local_4);
  pcVar1 = strdup(pcVar1);
  return pcVar1;
}

Assistant:

char *amqp_error_string(int code)
{
  /* Previously sometimes clients had to flip the sign on a return value from a
   * function to get the correct error code. Now, all error codes are negative.
   * To keep people's legacy code running correctly, we map all error codes to
   * negative values.
   *
   * This is only done with this deprecated function.
   */
  if (code > 0) {
    code = -code;
  }
  return strdup(amqp_error_string2(code));
}